

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eh_frame.cc
# Opt level: O1

void __thiscall bloaty::ReadEhFrame(bloaty *this,string_view data,RangeSink *sink)

{
  byte bVar1;
  uint8_t uVar2;
  char *pcVar3;
  uint uVar4;
  int iVar5;
  uint64_t label_from_vmaddr;
  _Hash_node_base *p_Var6;
  _Hash_node_base **__s;
  _Hash_node_base *p_Var7;
  _Hash_node_base *p_Var8;
  _Hash_node_base _Var9;
  RangeSink *sink_00;
  uint *puVar10;
  ulong uVar11;
  size_type __n;
  ulong uVar12;
  _Hash_node_base *p_Var13;
  size_t sVar14;
  pointer __ptr_1;
  bloaty *pbVar15;
  undefined1 auVar16 [16];
  string_view sVar17;
  string_view entry;
  __buckets_alloc_type __alloc;
  unordered_map<const_void_*,_CIEInfo,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_CIEInfo>_>_>
  cie_map;
  CompilationUnitSizes sizes;
  string_view local_a8;
  new_allocator<std::__detail::_Hash_node_base_*> local_91;
  char *local_90;
  _Hash_node_base **local_88;
  ulong local_80;
  _Hash_node_base local_78;
  ulong uStack_70;
  undefined4 local_68 [2];
  undefined8 local_60;
  _Hash_node_base *p_Stack_58;
  RangeSink *local_50;
  string_view local_48;
  CompilationUnitSizes local_34;
  
  sink_00 = (RangeSink *)data._M_str;
  local_48._M_str = (char *)data._M_len;
  local_88 = &p_Stack_58;
  local_80 = 1;
  local_78._M_nxt = (_Hash_node_base *)0x0;
  uStack_70 = 0;
  local_68[0] = 0x3f800000;
  local_60 = 0;
  p_Stack_58 = (_Hash_node_base *)0x0;
  _Var9._M_nxt = local_78._M_nxt;
  local_48._M_len = (size_t)this;
  if (this != (bloaty *)0x0) {
    local_90 = "Unexpected eh_frame CIE version";
    local_50 = sink_00;
    do {
      pcVar3 = local_48._M_str;
      sVar14 = local_48._M_len;
      local_a8 = dwarf::CompilationUnitSizes::ReadInitialLength(&local_34,&local_48);
      puVar10 = (uint *)local_a8._M_str;
      uVar11 = local_a8._M_len;
      _Var9._M_nxt = local_78._M_nxt;
      if (uVar11 == 0 && (bloaty *)local_48._M_len == (bloaty *)0x0) break;
      pbVar15 = (bloaty *)((uVar11 - (long)pcVar3) + (long)puVar10);
      if (sVar14 < pbVar15) {
        pbVar15 = (bloaty *)sVar14;
      }
      if (uVar11 < 4) {
        Throw("premature EOF reading fixed-length data",0x8d);
      }
      local_a8._M_str = (char *)(puVar10 + 1);
      local_a8._M_len = uVar11 - 4;
      if ((ulong)*puVar10 == 0) {
        uVar11 = (ulong)pcVar3 % local_80;
        p_Var6 = local_88[uVar11];
        p_Var7 = (_Hash_node_base *)0x0;
        if ((p_Var6 != (_Hash_node_base *)0x0) &&
           (p_Var7 = p_Var6, p_Var8 = p_Var6->_M_nxt,
           (_Hash_node_base *)pcVar3 != p_Var6->_M_nxt[1]._M_nxt)) {
          while (p_Var6 = p_Var8->_M_nxt, p_Var6 != (_Hash_node_base *)0x0) {
            p_Var7 = (_Hash_node_base *)0x0;
            if (((ulong)p_Var6[1]._M_nxt % local_80 != uVar11) ||
               (p_Var7 = p_Var8, p_Var8 = p_Var6, (_Hash_node_base *)pcVar3 == p_Var6[1]._M_nxt))
            goto LAB_001afca7;
          }
          p_Var7 = (_Hash_node_base *)0x0;
        }
LAB_001afca7:
        if (p_Var7 == (_Hash_node_base *)0x0) {
          p_Var6 = (_Hash_node_base *)0x0;
        }
        else {
          p_Var6 = p_Var7->_M_nxt;
        }
        if (p_Var6 == (_Hash_node_base *)0x0) {
          p_Var6 = (_Hash_node_base *)operator_new(0x30);
          p_Var6->_M_nxt = (_Hash_node_base *)0x0;
          p_Var6[1]._M_nxt = (_Hash_node_base *)pcVar3;
          p_Var6[2]._M_nxt = (_Hash_node_base *)0x0;
          p_Var6[3]._M_nxt = (_Hash_node_base *)0x0;
          p_Var6[4]._M_nxt = (_Hash_node_base *)0x0;
          p_Var6[5]._M_nxt = (_Hash_node_base *)0x0;
          auVar16 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                              ((ulong)local_68,local_80,uStack_70);
          __n = auVar16._8_8_;
          if ((auVar16 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            if (__n == 1) {
              p_Stack_58 = (_Hash_node_base *)0x0;
              __s = &p_Stack_58;
            }
            else {
              __s = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                              (&local_91,__n,(void *)0x0);
              memset(__s,0,__n * 8);
            }
            _Var9._M_nxt = local_78._M_nxt;
            local_78._M_nxt = (_Hash_node_base *)0x0;
            if (_Var9._M_nxt != (_Hash_node_base *)0x0) {
              uVar11 = 0;
              do {
                p_Var7 = (_Var9._M_nxt)->_M_nxt;
                uVar12 = (ulong)_Var9._M_nxt[1]._M_nxt % __n;
                if (__s[uVar12] == (_Hash_node_base *)0x0) {
                  (_Var9._M_nxt)->_M_nxt = local_78._M_nxt;
                  __s[uVar12] = &local_78;
                  local_78._M_nxt = _Var9._M_nxt;
                  if ((_Var9._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
                    p_Var8 = (_Hash_node_base *)(__s + uVar11);
                    goto LAB_001afd95;
                  }
                }
                else {
                  (_Var9._M_nxt)->_M_nxt = __s[uVar12]->_M_nxt;
                  p_Var8 = __s[uVar12];
                  uVar12 = uVar11;
LAB_001afd95:
                  p_Var8->_M_nxt = _Var9._M_nxt;
                }
                _Var9._M_nxt = p_Var7;
                uVar11 = uVar12;
              } while (p_Var7 != (_Hash_node_base *)0x0);
            }
            if (&p_Stack_58 != local_88) {
              operator_delete(local_88,local_80 << 3);
            }
            uVar11 = (ulong)pcVar3 % __n;
            local_88 = __s;
            local_80 = __n;
          }
          if (local_88[uVar11] == (_Hash_node_base *)0x0) {
            p_Var6->_M_nxt = local_78._M_nxt;
            if (local_78._M_nxt != (_Hash_node_base *)0x0) {
              local_88[(ulong)local_78._M_nxt[1]._M_nxt % local_80] = p_Var6;
            }
            local_88[uVar11] = &local_78;
            local_78._M_nxt = p_Var6;
          }
          else {
            p_Var6->_M_nxt = local_88[uVar11]->_M_nxt;
            local_88[uVar11]->_M_nxt = p_Var6;
          }
          uStack_70 = uStack_70 + 1;
          sink_00 = local_50;
        }
        if (local_a8._M_len == 0) {
          Throw("premature EOF reading fixed-length data",0x8d);
        }
        bVar1 = *local_a8._M_str;
        local_a8._M_str = local_a8._M_str + 1;
        local_a8._M_len = local_a8._M_len - 1;
        *(uint *)&p_Var6[2]._M_nxt = (uint)bVar1;
        sVar17 = ReadUntilConsuming(&local_a8,'\0');
        uVar4 = dwarf::ReadLEB128<unsigned_int>(&local_a8);
        *(uint *)((long)&p_Var6[2]._M_nxt + 4) = uVar4;
        iVar5 = dwarf::ReadLEB128<int>(&local_a8);
        *(int *)&p_Var6[3]._M_nxt = iVar5;
        iVar5 = *(int *)&p_Var6[2]._M_nxt;
        if (iVar5 == 1) {
          if (local_a8._M_len == 0) {
LAB_001b003e:
            iVar5 = 0x8d;
            local_90 = "premature EOF reading fixed-length data";
            goto LAB_001b0058;
          }
          uVar4 = (uint)(byte)*local_a8._M_str;
          local_a8._M_str = local_a8._M_str + 1;
          local_a8._M_len = local_a8._M_len - 1;
        }
        else {
          if (iVar5 != 3) {
            iVar5 = 0xa8;
LAB_001b0058:
            Throw(local_90,iVar5);
          }
          uVar4 = dwarf::ReadLEB128<unsigned_int>(&local_a8);
        }
        *(uint *)&p_Var6[5]._M_nxt = uVar4;
        if (sVar17._M_len != 0) {
          sVar14 = 0;
          do {
            iVar5 = 0xc1;
            switch(sVar17._M_str[sVar14]) {
            case 'L':
              if (local_a8._M_len == 0) goto LAB_001b003e;
              uVar2 = *local_a8._M_str;
              local_a8._M_str = local_a8._M_str + 1;
              local_a8._M_len = local_a8._M_len - 1;
              *(uint8_t *)((long)&p_Var6[3]._M_nxt + 5) = uVar2;
              break;
            case 'M':
            case 'N':
            case 'O':
            case 'Q':
switchD_001afef1_caseD_4d:
              local_90 = "Unexepcted augmentation character";
              goto LAB_001b0058;
            case 'P':
              if (local_a8._M_len == 0) {
                Throw("premature EOF reading fixed-length data",0x8d);
              }
              uVar2 = *local_a8._M_str;
              local_a8._M_str = local_a8._M_str + 1;
              local_a8._M_len = local_a8._M_len - 1;
              p_Var7 = (_Hash_node_base *)
                       ReadEncodedPointer(uVar2,true,&local_a8,(char *)0x0,sink_00);
              p_Var6[4]._M_nxt = p_Var7;
              break;
            case 'R':
              if (local_a8._M_len == 0) goto LAB_001b003e;
              uVar2 = *local_a8._M_str;
              local_a8._M_str = local_a8._M_str + 1;
              local_a8._M_len = local_a8._M_len - 1;
              *(uint8_t *)((long)&p_Var6[3]._M_nxt + 4) = uVar2;
              break;
            case 'S':
              *(undefined1 *)((long)&p_Var6[3]._M_nxt + 6) = 1;
              break;
            default:
              if (sVar17._M_str[sVar14] != 'z') goto switchD_001afef1_caseD_4d;
              *(undefined1 *)((long)&p_Var6[3]._M_nxt + 7) = 1;
              dwarf::ReadLEB128<unsigned_int>(&local_a8);
            }
            sVar14 = sVar14 + 1;
          } while (sVar17._M_len != sVar14);
        }
      }
      else {
        p_Var8 = (_Hash_node_base *)((long)(puVar10 + 1) + (-4 - (ulong)*puVar10));
        p_Var6 = local_88[(ulong)p_Var8 % local_80];
        p_Var7 = (_Hash_node_base *)0x0;
        if ((p_Var6 != (_Hash_node_base *)0x0) &&
           (p_Var7 = p_Var6, p_Var13 = p_Var6->_M_nxt, p_Var8 != p_Var6->_M_nxt[1]._M_nxt)) {
          while (p_Var6 = p_Var13->_M_nxt, p_Var6 != (_Hash_node_base *)0x0) {
            p_Var7 = (_Hash_node_base *)0x0;
            if (((ulong)p_Var6[1]._M_nxt % local_80 != (ulong)p_Var8 % local_80) ||
               (p_Var7 = p_Var13, p_Var13 = p_Var6, p_Var8 == p_Var6[1]._M_nxt)) goto LAB_001afc5d;
          }
          p_Var7 = (_Hash_node_base *)0x0;
        }
LAB_001afc5d:
        if (p_Var7 == (_Hash_node_base *)0x0) {
          p_Var6 = (_Hash_node_base *)0x0;
        }
        else {
          p_Var6 = p_Var7->_M_nxt;
        }
        if (p_Var6 == (_Hash_node_base *)0x0) {
          Throw("Couldn\'t find CIE for FDE",200);
        }
        label_from_vmaddr =
             ReadEncodedPointer(*(uint8_t *)((long)&p_Var6[3]._M_nxt + 4),true,&local_a8,(char *)0x0
                                ,sink_00);
        sVar17._M_str = pcVar3;
        sVar17._M_len = (size_t)pbVar15;
        RangeSink::AddFileRangeForVMAddr(sink_00,"dwarf_fde",label_from_vmaddr,sVar17);
      }
      _Var9._M_nxt = local_78._M_nxt;
    } while ((bloaty *)local_48._M_len != (bloaty *)0x0);
  }
  while (_Var9._M_nxt != (_Hash_node_base *)0x0) {
    p_Var6 = (_Var9._M_nxt)->_M_nxt;
    operator_delete(_Var9._M_nxt,0x30);
    _Var9._M_nxt = p_Var6;
  }
  memset(local_88,0,local_80 << 3);
  local_78._M_nxt = (_Hash_node_base *)0x0;
  uStack_70 = 0;
  if (&p_Stack_58 != local_88) {
    operator_delete(local_88,local_80 << 3);
  }
  return;
}

Assistant:

void ReadEhFrame(string_view data, RangeSink* sink) {
  string_view remaining = data;

  struct CIEInfo {
    int version = 0;
    uint32_t code_align = 0;
    int32_t data_align = 0;
    uint8_t fde_encoding = 0;
    uint8_t lsda_encoding = 0;
    bool is_signal_handler = false;
    bool has_augmentation_length = false;
    uint64_t personality_function = 0;
    uint32_t return_address_reg = 0;
  };

  std::unordered_map<const void*, CIEInfo> cie_map;

  while (remaining.size() > 0) {
    dwarf::CompilationUnitSizes sizes;
    string_view full_entry = remaining;
    string_view entry = sizes.ReadInitialLength(&remaining);
    if (entry.size() == 0 && remaining.size() == 0) {
      return;
    }
    full_entry =
        full_entry.substr(0, entry.size() + (entry.data() - full_entry.data()));
    uint32_t id = ReadFixed<uint32_t>(&entry);
    if (id == 0) {
      // CIE, we don't attribute this yet.
      CIEInfo& cie_info = cie_map[full_entry.data()];
      cie_info.version = ReadFixed<uint8_t>(&entry);
      string_view aug_string = ReadNullTerminated(&entry);
      cie_info.code_align = dwarf::ReadLEB128<uint32_t>(&entry);
      cie_info.data_align = dwarf::ReadLEB128<int32_t>(&entry);
      switch (cie_info.version) {
        case 1:
          cie_info.return_address_reg = ReadFixed<uint8_t>(&entry);
          break;
        case 3:
          cie_info.return_address_reg = dwarf::ReadLEB128<uint32_t>(&entry);
          break;
        default:
          THROW("Unexpected eh_frame CIE version");
      }
      while (aug_string.size() > 0) {
        switch (aug_string[0]) {
          case 'z':
            // Length until the end of augmentation data.
            cie_info.has_augmentation_length = true;
            dwarf::ReadLEB128<uint32_t>(&entry);
            break;
          case 'L':
            cie_info.lsda_encoding = ReadFixed<uint8_t>(&entry);
            break;
          case 'R':
            cie_info.fde_encoding = ReadFixed<uint8_t>(&entry);
            break;
          case 'S':
            cie_info.is_signal_handler = true;
            break;
          case 'P': {
            uint8_t encoding = ReadFixed<uint8_t>(&entry);
            cie_info.personality_function =
                ReadEncodedPointer(encoding, true, &entry, nullptr, sink);
            break;
          }
          default:
            THROW("Unexepcted augmentation character");
        }
        aug_string.remove_prefix(1);
      }
    } else {
      auto iter = cie_map.find(entry.data() - id - 4);
      if (iter == cie_map.end()) {
        THROW("Couldn't find CIE for FDE");
      }
      const CIEInfo& cie_info = iter->second;
      // TODO(haberman): don't hard-code 64-bit.
      uint64_t address = ReadEncodedPointer(cie_info.fde_encoding, true, &entry,
                                            nullptr, sink);
      // TODO(haberman); Technically the FDE addresses could span a
      // function/compilation unit?  They can certainly span inlines.
      /*
      uint64_t length =
        ReadEncodedPointer(cie_info.fde_encoding & 0xf, true, &entry, sink);
      (void)length;

      if (cie_info.has_augmentation_length) {
        uint32_t augmentation_length = dwarf::ReadLEB128<uint32_t>(&entry);
        (void)augmentation_length;
      }

      uint64_t lsda =
          ReadEncodedPointer(cie_info.lsda_encoding, true, &entry, sink);
      if (lsda) {
      }
      */

      sink->AddFileRangeForVMAddr("dwarf_fde", address, full_entry);
    }
  }
}